

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<unsigned_int>::loadFromIterator<Kernel::FormulaVarIterator>
          (Stack<unsigned_int> *this,FormulaVarIterator *it)

{
  bool bVar1;
  uint elem;
  
  while( true ) {
    bVar1 = Kernel::FormulaVarIterator::hasNext(it);
    if (!bVar1) break;
    elem = Kernel::FormulaVarIterator::next(it);
    push(this,elem);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }